

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn_pacman_agent.hh
# Opt level: O3

void __thiscall NN_Pacman_Agent::NN_Pacman_Agent(NN_Pacman_Agent *this,string *neural_network_path)

{
  uint uVar1;
  pointer pdVar2;
  ostream *poVar3;
  size_t sVar4;
  char str [200];
  allocator_type local_e9;
  vector<double,_std::allocator<double>_> local_e8;
  char acStack_d0 [176];
  
  (this->super_Agent)._vptr_Agent = (_func_int **)&PTR_take_action_00120d40;
  Neural_Network::Neural_Network(&this->nn,neural_network_path,0.0);
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar1 = (this->nn).n_inputs;
  if (uVar1 == RL_Pacman_Agent_Inputs::n_inputs) {
    std::vector<double,_std::allocator<double>_>::vector(&local_e8,(long)(int)uVar1,&local_e9);
    pdVar2 = (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->input).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar2 != (pointer)0x0) {
      operator_delete(pdVar2);
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    return;
  }
  builtin_strncpy(acStack_d0,"trained with different inputs",0x1e);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x20736177206b726f;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x75656e2073696854;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x7774656e206c6172;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error[",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/agents/pacman/rl/nn_pacman_agent.hh"
             ,0x76);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"NN_Pacman_Agent",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][Line ",7);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
  sVar4 = strlen((char *)&local_e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_e8,sVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

NN_Pacman_Agent(string neural_network_path) : nn(neural_network_path, 0.0) {
        ensure(nn.n_inputs == uint(RL_Pacman_Agent_Inputs::n_inputs), "This neural network was trained with different inputs");
        input = vector<double>(RL_Pacman_Agent_Inputs::n_inputs);
    }